

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_dwa_channeldata.h
# Opt level: O3

exr_result_t DctCoderChannelData_push_row(DctCoderChannelData *d,uint8_t *r)

{
  uint8_t **__src;
  uint8_t **__dest;
  size_t sVar1;
  ulong uVar2;
  
  sVar1 = d->_size;
  if (sVar1 == d->_row_alloc_count) {
    uVar2 = 0x10;
    if (sVar1 != 0) {
      uVar2 = sVar1 * 3 >> 1;
    }
    __dest = (uint8_t **)internal_exr_alloc(uVar2 * 8);
    if (__dest == (uint8_t **)0x0) {
      return 1;
    }
    __src = d->_rows;
    if (__src != (uint8_t **)0x0) {
      memcpy(__dest,__src,d->_size << 3);
      internal_exr_free(__src);
    }
    d->_rows = __dest;
    d->_row_alloc_count = uVar2;
    sVar1 = d->_size;
  }
  else {
    __dest = d->_rows;
  }
  __dest[sVar1] = r;
  d->_size = sVar1 + 1;
  return 0;
}

Assistant:

static exr_result_t
DctCoderChannelData_push_row (DctCoderChannelData* d, uint8_t* r)
{
    if (d->_size == d->_row_alloc_count)
    {
        size_t    nsize = d->_size == 0 ? 16 : ((d->_size * 3) / 2);
        uint8_t** n     = (uint8_t**) internal_exr_alloc (nsize * sizeof (uint8_t*));
        if (n)
        {
            if (d->_rows)
            {
                memcpy (n, d->_rows, sizeof (uint8_t*) * d->_size);
                internal_exr_free (d->_rows);
            }
            d->_rows            = n;
            d->_row_alloc_count = nsize;
        }
        else { return EXR_ERR_OUT_OF_MEMORY; }
    }
    d->_rows[d->_size] = r;
    d->_size++;
    return EXR_ERR_SUCCESS;
}